

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLRSA.cpp
# Opt level: O3

bool __thiscall OSSLRSA::verifyUpdate(OSSLRSA *this,ByteString *originalData)

{
  HashAlgorithm *pHVar1;
  bool bVar2;
  int iVar3;
  ByteString dummy;
  ByteString local_40;
  
  bVar2 = AsymmetricAlgorithm::verifyUpdate(&this->super_AsymmetricAlgorithm,originalData);
  if (bVar2) {
    iVar3 = (*this->pCurrentHash->_vptr_HashAlgorithm[3])(this->pCurrentHash,originalData);
    if ((char)iVar3 == '\0') {
      if (this->pCurrentHash != (HashAlgorithm *)0x0) {
        (*this->pCurrentHash->_vptr_HashAlgorithm[1])();
      }
      this->pCurrentHash = (HashAlgorithm *)0x0;
      ByteString::ByteString(&local_40);
      AsymmetricAlgorithm::verifyFinal(&this->super_AsymmetricAlgorithm,&local_40);
    }
    else {
      pHVar1 = this->pSecondHash;
      if (pHVar1 == (HashAlgorithm *)0x0) {
        return true;
      }
      iVar3 = (*pHVar1->_vptr_HashAlgorithm[3])(pHVar1,originalData);
      if ((char)iVar3 != '\0') {
        return true;
      }
      if (this->pCurrentHash != (HashAlgorithm *)0x0) {
        (*this->pCurrentHash->_vptr_HashAlgorithm[1])();
      }
      this->pCurrentHash = (HashAlgorithm *)0x0;
      if (this->pSecondHash != (HashAlgorithm *)0x0) {
        (*this->pSecondHash->_vptr_HashAlgorithm[1])();
      }
      this->pSecondHash = (HashAlgorithm *)0x0;
      ByteString::ByteString(&local_40);
      AsymmetricAlgorithm::verifyFinal(&this->super_AsymmetricAlgorithm,&local_40);
    }
    local_40._vptr_ByteString = (_func_int **)&PTR__ByteString_00151bd0;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_40.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  return false;
}

Assistant:

bool OSSLRSA::verifyUpdate(const ByteString& originalData)
{
	if (!AsymmetricAlgorithm::verifyUpdate(originalData))
	{
		return false;
	}

	if (!pCurrentHash->hashUpdate(originalData))
	{
		delete pCurrentHash;
		pCurrentHash = NULL;

		ByteString dummy;
		AsymmetricAlgorithm::verifyFinal(dummy);

		return false;
	}

	if ((pSecondHash != NULL) && !pSecondHash->hashUpdate(originalData))
	{
		delete pCurrentHash;
		pCurrentHash = NULL;

		delete pSecondHash;
		pSecondHash = NULL;

		ByteString dummy;
		AsymmetricAlgorithm::verifyFinal(dummy);

		return false;
	}

	return true;
}